

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O3

void __thiscall
glcts::TextureBufferTextureBufferRange::logError
          (TextureBufferTextureBufferRange *this,char *phase,char *internalFormat,GLuint component,
          char *exptectedValue,char *resultValue)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  local_1b0 = (undefined1  [8])
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Result is different for ",0x18);
  iVar1 = (int)(ostringstream *)&local_1a8;
  if (phase == (char *)0x0) {
    std::ios::clear(iVar1 + (int)local_1a8[-3]);
  }
  else {
    sVar2 = strlen(phase);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,phase,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," phase \n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Internal Format: ",0x11)
  ;
  if (internalFormat == (char *)0x0) {
    std::ios::clear(iVar1 + (int)local_1a8[-3]);
  }
  else {
    sVar2 = strlen(internalFormat);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,internalFormat,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Component Position: ",0x14);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Expected value: ",0x10);
  if (exptectedValue == (char *)0x0) {
    std::ios::clear(iVar1 + (int)local_1a8[-3]);
  }
  else {
    sVar2 = strlen(exptectedValue);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,exptectedValue,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Result value: ",0xe);
  if (resultValue == (char *)0x0) {
    std::ios::clear(iVar1 + (int)local_1a8[-3]);
  }
  else {
    sVar2 = strlen(resultValue);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,resultValue,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void TextureBufferTextureBufferRange::logError(const char* phase, const char* internalFormat, glw::GLuint component,
											   const char* exptectedValue, const char* resultValue)
{
	m_testCtx.getLog() << tcu::TestLog::Message << "Result is different for " << phase << " phase \n"
					   << "Internal Format: " << internalFormat << "\n"
					   << "Component Position: " << component << "\n"
					   << "Expected value: " << exptectedValue << "\n"
					   << "Result value: " << resultValue << "\n"
					   << tcu::TestLog::EndMessage;
}